

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

bool __thiscall QPDFFormFieldObjectHelper::isChecked(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  undefined1 local_50 [64];
  
  bVar1 = isCheckbox(this);
  if (bVar1) {
    getValue((QPDFFormFieldObjectHelper *)(local_50 + 0x10));
    bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_50 + 0x10));
    if (bVar1) {
      getValue((QPDFFormFieldObjectHelper *)local_50);
      QPDFObjectHandle::getName_abi_cxx11_((string *)(local_50 + 0x20),(QPDFObjectHandle *)local_50)
      ;
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_50 + 0x20),"/Off");
      std::__cxx11::string::~string((string *)(local_50 + 0x20));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    }
    else {
      bVar1 = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isChecked()
{
    return isCheckbox() && getValue().isName() && (getValue().getName() != "/Off");
}